

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

lys_node * warn_get_snode_in_ctx(lyxp_set *set)

{
  uint uVar1;
  
  if ((set != (lyxp_set *)0x0) && (set->type == LYXP_SET_SNODE_SET)) {
    uVar1 = set->used;
    do {
      uVar1 = uVar1 - 1;
      if ((set->val).nodes[uVar1].pos == 1) {
        return (lys_node *)(set->val).nodes[uVar1].node;
      }
    } while (uVar1 != 0);
    return (lys_node *)0x0;
  }
  return (lys_node *)0x0;
}

Assistant:

static struct lys_node *
warn_get_snode_in_ctx(struct lyxp_set *set)
{
    uint32_t i;

    if (!set || (set->type != LYXP_SET_SNODE_SET)) {
        return NULL;
    }

    i = set->used;
    do {
        --i;
        if (set->val.snodes[i].in_ctx == 1) {
            /* if there are more, simply return the first found (last added) */
            return set->val.snodes[i].snode;
        }
    } while (i);

    return NULL;
}